

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_
          (string_t *__return_storage_ptr__,format_t<int,cfgfile::string_trait_t> *this,int *value)

{
  std::__cxx11::to_string(__return_storage_ptr__,*(int *)this);
  return __return_storage_ptr__;
}

Assistant:

static string_trait_t::string_t to_string( const int & value )
	{
		return std::to_string( value );
	}